

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_reroll_item(command *cmd)

{
  bitflag bVar1;
  uint16_t uVar2;
  object *poVar3;
  loc lVar4;
  _Bool _Var5;
  byte bVar6;
  wchar_t wVar7;
  object *obj_00;
  bool good;
  wchar_t roll_choice;
  object *obj;
  object *new;
  wchar_t update;
  object *local_48;
  object *poStack_40;
  
  roll_choice = L'\0';
  update = L'\0';
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar7 != L'\0') {
    _Var5 = get_item(&obj,"Reroll which item? ","You have nothing to reroll.",cmd->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var5) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
  }
  wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&roll_choice);
  if (wVar7 != L'\0') {
    _Var5 = get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ",(char *)&new);
    if (!_Var5) {
      return;
    }
    bVar6 = (byte)new & 0xdf;
    if (bVar6 == 0x45) {
      roll_choice = L'\x02';
      wVar7 = L'\x02';
    }
    else if (bVar6 == 0x47) {
      roll_choice = L'\x01';
      wVar7 = L'\x01';
    }
    else {
      if (bVar6 != 0x4e) {
        return;
      }
      roll_choice = L'\0';
      wVar7 = L'\0';
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",wVar7);
  }
  if ((roll_choice == L'\0') || (roll_choice == L'\x01')) {
    _Var5 = false;
  }
  else {
    if (roll_choice != L'\x02') {
      return;
    }
    _Var5 = true;
  }
  if (obj->artifact == (artifact *)0x0) {
    good = roll_choice != L'\0';
    obj_00 = object_new();
    new = obj_00;
    object_prep(obj_00,obj->kind,(int)player->depth,RANDOMISE);
    apply_magic(obj_00,(int)player->depth,false,good,_Var5,false);
    poVar3 = obj->known;
    uVar2 = obj->oidx;
    lVar4 = obj->grid;
    bVar1 = obj->notice;
    local_48 = obj->prev;
    poStack_40 = obj->next;
    mem_free(obj->slays);
    obj->slays = (_Bool *)0x0;
    mem_free(obj->brands);
    obj->brands = (_Bool *)0x0;
    mem_free(obj->curses);
    obj->curses = (curse_data *)0x0;
    object_copy(obj,obj_00);
    obj->prev = local_48;
    obj->next = poStack_40;
    obj->known = poVar3;
    poVar3->ego = obj->ego;
    obj->oidx = uVar2;
    obj->grid = lVar4;
    obj->notice = bVar1;
    obj->origin = '\x13';
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"update",&update);
    if (wVar7 == L'\0' && update == L'\0') {
      wiz_play_item_notify_changed();
    }
    else {
      wiz_play_item_standard_upkeep(player,obj);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&new);
  }
  return;
}

Assistant:

void do_cmd_wiz_reroll_item(struct command *cmd)
{
	bool good = false;
	bool great = false;
	int roll_choice = 0;
	int update = 0;
	struct object *obj;
	struct object *new;

	/* Get the item to reroll. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Reroll which item? ",
				"You have nothing to reroll.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get the type of roll to use. */
	if (cmd_get_arg_choice(cmd, "choice", &roll_choice) != CMD_OK) {
		char ch;

		if (!get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ", &ch)) {
			return;
		}
		if (ch == 'n' || ch == 'N') {
			roll_choice = 0;
		} else if (ch == 'g' || ch == 'G') {
			roll_choice = 1;
		} else if (ch == 'e' || ch == 'E') {
			roll_choice = 2;
		} else {
			return;
		}
		cmd_set_arg_choice(cmd, "choice", roll_choice);
	}
	if (roll_choice == 0) {
		good = false;
		great = false;
	} else if (roll_choice == 1) {
		good = true;
		great = false;
	} else if (roll_choice == 2) {
		good = true;
		great = true;
	} else {
		return;
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) {
		return;
	}

	/* Get a new object with a clean slate. */
	new = object_new();

	/* Reroll based on old kind and player's depth.  Then apply magic. */
	object_prep(new, obj->kind, player->depth, RANDOMISE);
	apply_magic(new, player->depth, false, good, great, false);

	/* Copy over changes to the original. */
	{
		/* Record old pile information. */
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known_obj = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		/* Free slays, brands, and curses on the old object by hand. */
		mem_free(obj->slays);
		obj->slays = NULL;
		mem_free(obj->brands);
		obj->brands = NULL;
		mem_free(obj->curses);
		obj->curses = NULL;

		/* Copy over; pile information needs to be restored. */
		object_copy(obj, new);
		obj->prev = prev;
		obj->next = next;
		obj->known = known_obj;
		obj->known->ego = obj->ego;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
	}

	/* Mark as cheat */
	obj->origin = ORIGIN_CHEAT;

	/* Flag what needs to be updated. */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}

	/* Free the copy. */
	object_delete(cave, player->cave, &new);
}